

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O2

int check_fixed_log(char *card,FILE *out)

{
  char cVar1;
  long lVar2;
  int iVar3;
  
  lVar2 = 10;
  while( true ) {
    cVar1 = card[lVar2];
    if (cVar1 != ' ') break;
    lVar2 = lVar2 + 1;
  }
  if ((cVar1 == 'F') || (cVar1 == 'T')) {
    if (lVar2 == 0x1d) {
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
      sprintf(errmes,"%.8s mandatory keyword is not in logical fixed format:",card);
      wrterr(out,errmes,1);
      print_fmt(out,card,0xd);
      print_fmt(out,"          -------------------^",0xd);
    }
  }
  else {
    iVar3 = 0;
    sprintf(errmes,"%.8s mandatory keyword does not have T or F logical value.",card);
    wrterr(out,errmes,1);
  }
  return iVar3;
}

Assistant:

int check_fixed_log(char* card, FILE *out) 
{
    char *cptr;

    /* fixed format logical must have T or F in column 30 */

    cptr = &card[10];

    while (*cptr == ' ')cptr++;  /* skip leading spaces */

    if (*cptr != 'T' && *cptr != 'F') {
        sprintf(errmes,
            "%.8s mandatory keyword does not have T or F logical value.",
        card);
        wrterr(out,errmes,1); 
        return 0;
    }

    /* should be pointing to column 31 of the card */

    if ((cptr - card)  != 29) {
        sprintf(errmes,
            "%.8s mandatory keyword is not in logical fixed format:",
        card);
        wrterr(out,errmes,1); 
        print_fmt(out,card,13);
        print_fmt(out,"          -------------------^",13);

        return 0;
    } 
    return 1; 
}